

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall MxxSort_StableSort_Test::TestBody(MxxSort_StableSort_Test *this)

{
  pointer *this_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type_conflict sVar6;
  reference this_01;
  iterator iVar7;
  iterator iVar8;
  char *message;
  char *in_R9;
  int local_120;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0 [2];
  tuple<int,_int,_int> *local_c0;
  tuple<int,_int,_int> *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001_for__M_comp full_cmp;
  int local_84;
  anon_class_1_0_00000001 snd_cmp;
  unsigned_long uStack_80;
  int local_78;
  tuple<int,_int,_int> local_74;
  ulong local_68;
  size_t i;
  size_t prefix;
  undefined1 local_48 [8];
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> vec;
  comm c;
  MxxSort_StableSort_Test *this_local;
  
  this_00 = &vec.
             super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mxx::comm::comm((comm *)this_00);
  iVar3 = mxx::comm::rank((comm *)this_00);
  std::allocator<std::tuple<int,_int,_int>_>::allocator
            ((allocator<std::tuple<int,_int,_int>_> *)((long)&prefix + 3));
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_48,(long)(iVar3 + 100),
             (allocator<std::tuple<int,_int,_int>_> *)((long)&prefix + 3));
  std::allocator<std::tuple<int,_int,_int>_>::~allocator
            ((allocator<std::tuple<int,_int,_int>_> *)((long)&prefix + 3));
  iVar3 = mxx::comm::rank((comm *)&vec.
                                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar3 == 0) {
    local_120 = 0;
  }
  else {
    iVar3 = mxx::comm::rank((comm *)&vec.
                                     super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar4 = mxx::comm::rank((comm *)&vec.
                                     super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar5 = mxx::comm::rank((comm *)&vec.
                                     super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_120 = iVar3 * 100 + ((iVar4 + 1) * iVar5) / 2;
  }
  i = (size_t)local_120;
  iVar3 = mxx::comm::rank((comm *)&vec.
                                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  srand(iVar3 * 7);
  for (local_68 = 0; uVar1 = local_68,
      sVar6 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
              size((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )local_48), uVar1 < sVar6; local_68 = local_68 + 1) {
    local_78 = mxx::comm::rank((comm *)&vec.
                                        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uStack_80 = i + local_68;
    local_84 = rand();
    local_84 = local_84 % 4;
    std::tuple<int,_int,_int>::tuple<int,_unsigned_long,_int,_true,_true>
              (&local_74,&local_78,&stack0xffffffffffffff80,&local_84);
    this_01 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
              operator[]((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                          *)local_48,local_68);
    std::tuple<int,_int,_int>::operator=(this_01,&local_74);
  }
  iVar7 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::begin
                    ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)local_48);
  iVar8 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::end
                    ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)local_48);
  mxx::
  stable_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
            (iVar7._M_current,iVar8._M_current,
             &vec.
              super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b8 = (tuple<int,_int,_int> *)
             std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
             begin((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )local_48);
  local_c0 = (tuple<int,_int,_int> *)
             std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
             end((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 local_48);
  bVar2 = mxx::
          is_sorted<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__1>
                    (local_b8,local_c0,
                     &vec.
                      super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_b0,bVar2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_b0,
               (AssertionResult *)"mxx::is_sorted(vec.begin(), vec.end(), full_cmp, c)","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x74,message);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_48);
  mxx::comm::~comm((comm *)&vec.
                            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxSort, StableSort) {
    mxx::comm c;
    typedef std::tuple<int,int,int> tuple_t;
    std::vector<tuple_t> vec(100+c.rank());
    size_t prefix = c.rank() == 0 ? 0 : (100*(c.rank()) + ((c.rank()+1)*c.rank())/2);
    std::srand(c.rank()*7);
    for (size_t i = 0; i < vec.size(); ++i) {
        vec[i] = tuple_t(c.rank(), prefix+i, std::rand() % 4);
    }

    auto snd_cmp = [](const tuple_t& x, const tuple_t& y) {
        return std::get<2>(x) < std::get<2>(y);
    };
    // stably sort only by second index
    mxx::stable_sort(vec.begin(), vec.end(), snd_cmp, c);

    //c.exlusively_in_order_do([&]() {
    //    std::cout << "[Rank " << c.rank() << "]: " << vec << std::endl;
    //});

    // assert it is sorted lexicographically by both (second, first)
    auto full_cmp = [](const tuple_t& x, const tuple_t& y) {
        return std::get<2>(x) < std::get<2>(y) || (std::get<2>(x) == std::get<2>(y) && std::get<1>(x) < std::get<1>(y));
    };
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), full_cmp, c));
}